

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O1

IPAsKeyLRU * __thiscall LruHash<IPAsKeyLRU>::Remove(LruHash<IPAsKeyLRU> *this,IPAsKeyLRU *key)

{
  IPAsKeyLRU *pIVar1;
  IPAsKeyLRU *pIVar2;
  LruHash<IPAsKeyLRU> *pLVar3;
  IPAsKeyLRU **ppIVar4;
  
  pIVar2 = BinHash<IPAsKeyLRU>::Remove(&this->binHash,key);
  if (pIVar2 != (IPAsKeyLRU *)0x0) {
    pIVar1 = pIVar2->MoreRecentKey;
    pLVar3 = (LruHash<IPAsKeyLRU> *)&pIVar1->LessRecentKey;
    if (pIVar1 == (IPAsKeyLRU *)0x0) {
      pLVar3 = this;
    }
    pLVar3->MostRecentlyUsed = pIVar2->LessRecentKey;
    ppIVar4 = &pIVar2->LessRecentKey->MoreRecentKey;
    if (pIVar2->LessRecentKey == (IPAsKeyLRU *)0x0) {
      ppIVar4 = &this->LeastRecentlyUsed;
    }
    *ppIVar4 = pIVar1;
    pIVar2->MoreRecentKey = (IPAsKeyLRU *)0x0;
    pIVar2->LessRecentKey = (IPAsKeyLRU *)0x0;
  }
  return pIVar2;
}

Assistant:

KeyObj * Remove(KeyObj * key)
    {
        KeyObj * retKey = binHash.Remove(key);

        if (retKey != NULL)
        {
            LruUnlink(retKey);
        }

        return retKey;
    }